

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmissionSystem::~EmissionSystem(EmissionSystem *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmissionSystem_00223298;
  pEVar1 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**(pEVar3->super_DataTypeBase)._vptr_DataTypeBase)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->m_vEmitterBeams).
    super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::~vector
            (&this->m_vEmitterBeams);
  DataTypeBase::~DataTypeBase(&(this->m_Location).super_DataTypeBase);
  EmitterSystem::~EmitterSystem(&this->m_EmitterSystemRecord);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

EmissionSystem::~EmissionSystem()
{
    m_vEmitterBeams.clear();
}